

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_67::BinaryReaderIR::OnCatchExpr(BinaryReaderIR *this)

{
  bool bVar1;
  Result result;
  reference base;
  TryExpr *pTVar2;
  LabelNode *local_30;
  LabelNode *parent_label;
  LabelNode *local_20;
  LabelNode *label;
  BinaryReaderIR *this_local;
  
  label = (LabelNode *)this;
  parent_label._4_4_ = TopLabel(this,&local_20);
  bVar1 = Failed(parent_label._4_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else if (local_20->label_type == Try) {
    result = GetLabelAt(this,&local_30,1);
    bVar1 = Failed(result);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      local_20->label_type = Catch;
      base = intrusive_list<wabt::Expr>::back(local_30->exprs);
      pTVar2 = cast<wabt::TryExpr,wabt::Expr>(base);
      local_20->exprs = &pTVar2->catch_;
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  else {
    PrintError(this,"catch expression without matching try");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnCatchExpr() {
  LabelNode* label;
  CHECK_RESULT(TopLabel(&label));
  if (label->label_type != LabelType::Try) {
    PrintError("catch expression without matching try");
    return Result::Error;
  }

  LabelNode* parent_label;
  CHECK_RESULT(GetLabelAt(&parent_label, 1));

  label->label_type = LabelType::Catch;
  label->exprs = &cast<TryExpr>(&parent_label->exprs->back())->catch_;
  return Result::Ok;
}